

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdObjCreate(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  If_DsdObj_t *pIVar6;
  ulong uVar7;
  
  if (nLits != 3 && Type == 5) {
    __assert_fail("Type != DAU_DSD_MUX || nLits == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3c3,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (Type == 5) {
    if (pLits[1] < 0) {
LAB_00421e16:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((pLits[1] & 1U) != 0) {
      if (pLits[2] < 0) goto LAB_00421e16;
      if ((pLits[2] & 1U) != 0) {
        __assert_fail("Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x3c5,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
    }
    pIVar6 = If_DsdObjAlloc(p,5,nLits);
  }
  else {
    if (0 < nLits && Type - 3U < 2) {
      uVar5 = 0xffffffff;
      uVar7 = 0;
      do {
        uVar2 = pLits[uVar7];
        if ((int)uVar2 < 0) goto LAB_00421d5c;
        if ((p->vObjs).nSize <= (int)(uVar2 >> 1)) goto LAB_00421d3d;
        pvVar3 = (p->vObjs).pArray[uVar2 >> 1];
        if (Type == 4) {
          if ((*(uint *)((long)pvVar3 + 4) & 7) == 4) {
            __assert_fail("Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x3cd,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
          }
        }
        else if (((Type == 3) && ((uVar2 & 1) == 0)) && ((*(uint *)((long)pvVar3 + 4) & 7) == 3)) {
          __assert_fail("Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x3cc,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
        }
        if (uVar5 != 0xffffffff) {
          iVar4 = If_DsdObjCompare(p,&p->vObjs,uVar5,uVar2);
          if (0 < iVar4) {
            __assert_fail("iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x3ce,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
          }
          uVar2 = pLits[uVar7];
        }
        uVar5 = uVar2;
        uVar7 = uVar7 + 1;
      } while ((uint)nLits != uVar7);
    }
    pIVar6 = If_DsdObjAlloc(p,Type,nLits);
    if (Type == 6) {
      if ((*(uint *)&pIVar6->field_0x4 < 0x18000000) || ((*(uint *)&pIVar6->field_0x4 & 7) != 6)) {
        __assert_fail("pObj->Type == IF_DSD_PRIME && pObj->nFans > 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x74,"void If_DsdObjSetTruth(If_DsdMan_t *, If_DsdObj_t *, int)");
      }
      uVar5 = pIVar6->Id;
      if (((long)(int)uVar5 < 0) || ((p->vTruths).nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vTruths).pArray[(int)uVar5] = truthId;
    }
  }
  uVar5 = *(uint *)&pIVar6->field_0x4;
  if ((uVar5 & 0xf8) != 0) {
    __assert_fail("pObj->nSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3d6,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (0 < nLits) {
    uVar7 = 0;
    do {
      uVar2 = pLits[uVar7];
      (&pIVar6[1].Id)[uVar7] = uVar2;
      if ((int)uVar2 < 0) {
LAB_00421d5c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if ((p->vObjs).nSize <= (int)(uVar2 >> 1)) goto LAB_00421d3d;
      uVar5 = uVar5 & 0xffffff07 |
              (*(uint *)((long)(p->vObjs).pArray[uVar2 >> 1] + 4) & 0xf8) + uVar5 & 0xf8;
      *(uint *)&pIVar6->field_0x4 = uVar5;
      uVar7 = uVar7 + 1;
    } while ((uint)nLits != uVar7);
  }
  if (p->LutSize != 0) {
    if ((int)pIVar6->Id < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar5 = If_DsdManCheckXY_int(p,pIVar6->Id * 2,p->LutSize,0,0,0);
    if (uVar5 == 0) {
      uVar5 = pIVar6->Id;
      if (((long)(int)uVar5 < 0) || ((p->vObjs).nSize <= (int)uVar5)) {
LAB_00421d3d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)(p->vObjs).pArray[(int)uVar5] + 4);
      *puVar1 = *puVar1 | 0x100;
    }
  }
  return pIVar6->Id;
}

Assistant:

int If_DsdObjCreate( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj, * pFanin;
    int i, iPrev = -1;
    // check structural canonicity
    assert( Type != DAU_DSD_MUX || nLits == 3 );
//    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[0]) );
    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2]) );
    // check that leaves are in good order
    if ( Type == DAU_DSD_AND || Type == DAU_DSD_XOR )
    {
        for ( i = 0; i < nLits; i++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[i]) );
            assert( Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND );
            assert( Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR );
            assert( iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0 );
            iPrev = pLits[i];
        }
    }
    // create new node
    pObj = If_DsdObjAlloc( p, Type, nLits );
    if ( Type == DAU_DSD_PRIME )
        If_DsdObjSetTruth( p, pObj, truthId );
    assert( pObj->nSupp == 0 );
    for ( i = 0; i < nLits; i++ )
    {
        pObj->pFans[i] = pLits[i];
        pObj->nSupp += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    // check decomposability
    if ( p->LutSize && !If_DsdManCheckXY(p, Abc_Var2Lit(pObj->Id, 0), p->LutSize, 0, 0, 0, 0) )
        If_DsdVecObjSetMark( &p->vObjs, pObj->Id );
    return pObj->Id;
}